

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O0

locale booster::locale::impl_posix::create_convert
                 (locale *in,shared_ptr<__locale_struct_*> *lc,character_facet_type type)

{
  char cVar1;
  bool bVar2;
  element_type *pp_Var3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  locale *plVar7;
  shared_ptr<__locale_struct_*> *this;
  int in_ECX;
  std_converter<char> *in_RSI;
  _Impl *in_RDI;
  uint i;
  string encoding;
  shared_ptr<__locale_struct_*> *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  shared_ptr<__locale_struct_*> *in_stack_fffffffffffffec8;
  shared_ptr<__locale_struct_*> *lc_00;
  utf8_converter *in_stack_fffffffffffffed0;
  std_converter<wchar_t> *this_00;
  utf8_converter *in_stack_fffffffffffffee0;
  locale *in_stack_fffffffffffffee8;
  locale *in_stack_fffffffffffffef0;
  std_converter<wchar_t> local_98;
  undefined4 local_70;
  undefined1 local_69;
  locale local_68 [2];
  uint local_58;
  allocator local_41;
  string local_40 [48];
  std_converter<char> *local_10;
  
  if (in_ECX == 1) {
    local_10 = in_RSI;
    pp_Var3 = std::__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator*((__shared_ptr_access<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)in_stack_fffffffffffffec0);
    pcVar4 = nl_langinfo_l(0xe,(__locale_t)*pp_Var3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar4,&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    for (local_58 = 0; uVar5 = (ulong)local_58, uVar6 = std::__cxx11::string::size(), uVar5 < uVar6;
        local_58 = local_58 + 1) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      if (('@' < *pcVar4) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40), *pcVar4 < '[')) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        cVar1 = *pcVar4;
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        *pcVar4 = cVar1 + ' ';
      }
    }
    bVar2 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
    if (((bVar2) ||
        (bVar2 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8), bVar2
        )) || (bVar2 = std::operator==(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8),
              bVar2)) {
      operator_new(0x20);
      local_69 = 1;
      plVar7 = local_68;
      std::shared_ptr<__locale_struct_*>::shared_ptr
                ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      utf8_converter::utf8_converter
                (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0);
      local_69 = 0;
      std::locale::locale<booster::locale::impl_posix::utf8_converter>
                (plVar7,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x2856e0);
    }
    else {
      plVar7 = (locale *)operator_new(0x20);
      local_98.lc_.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_ =
           1;
      std::shared_ptr<__locale_struct_*>::shared_ptr
                ((shared_ptr<__locale_struct_*> *)in_stack_fffffffffffffec0,
                 in_stack_fffffffffffffeb8);
      std_converter<char>::std_converter
                ((std_converter<char> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 (size_t)in_stack_fffffffffffffec0);
      local_98.lc_.super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr._7_1_ =
           0;
      std::locale::locale<booster::locale::impl_posix::std_converter<char>>
                (in_stack_fffffffffffffef0,plVar7,local_10);
      std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x2857af);
    }
    local_70 = 1;
    std::__cxx11::string::~string(local_40);
    return (locale)in_RDI;
  }
  if (in_ECX != 2) {
    std::locale::locale((locale *)in_RDI,(locale *)in_RSI);
    return (locale)in_RDI;
  }
  this = (shared_ptr<__locale_struct_*> *)operator_new(0x20);
  this_00 = &local_98;
  lc_00 = this;
  std::shared_ptr<__locale_struct_*>::shared_ptr(this,(shared_ptr<__locale_struct_*> *)in_RSI);
  std_converter<wchar_t>::std_converter(this_00,lc_00,(size_t)this);
  std::locale::locale<booster::locale::impl_posix::std_converter<wchar_t>>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (std_converter<wchar_t> *)in_stack_fffffffffffffee0);
  std::shared_ptr<__locale_struct_*>::~shared_ptr((shared_ptr<__locale_struct_*> *)0x28589d);
  return (locale)in_RDI;
}

Assistant:

std::locale create_convert( std::locale const &in,
                            booster::shared_ptr<locale_t> lc,
                            character_facet_type type)
{
        switch(type) {
        case char_facet: 
            {
                std::string encoding = nl_langinfo_l(CODESET,*lc);
                for(unsigned i=0;i<encoding.size();i++)
                    if('A'<=encoding[i] && encoding[i]<='Z')
                        encoding[i]=encoding[i]-'A'+'a';
                if(encoding=="utf-8" || encoding=="utf8" || encoding=="utf_8") {
                    return std::locale(in,new utf8_converter(lc));
                }
                return std::locale(in,new std_converter<char>(lc));
            }
        case wchar_t_facet:
            return std::locale(in,new std_converter<wchar_t>(lc));
        default:
            return in;
        }
}